

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_irExpression *
build_ir_constructor(Context_conflict *ctx,MOJOSHADER_astExpressionConstructor *ast)

{
  MOJOSHADER_astDataTypeType type_00;
  int elements;
  MOJOSHADER_astDataType *dt_00;
  MOJOSHADER_astDataType *pMVar1;
  MOJOSHADER_irExprList *args;
  MOJOSHADER_irExpression *pMVar2;
  int elems;
  MOJOSHADER_astDataTypeType type;
  MOJOSHADER_astDataType *dt;
  MOJOSHADER_astExpressionConstructor *ast_local;
  Context_conflict *ctx_local;
  
  dt_00 = reduce_datatype(ctx,ast->datatype);
  pMVar1 = datatype_base(ctx,dt_00);
  type_00 = pMVar1->type;
  elements = datatype_elems(ctx,dt_00);
  if (elements < 0x11) {
    args = build_ir_exprlist(ctx,ast->args);
    pMVar2 = new_ir_construct(ctx,args,type_00,elements);
    return pMVar2;
  }
  __assert_fail("elems <= 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                ,0x1498,
                "MOJOSHADER_irExpression *build_ir_constructor(Context *, const MOJOSHADER_astExpressionConstructor *)"
               );
}

Assistant:

static MOJOSHADER_irExpression *build_ir_constructor(Context *ctx, const MOJOSHADER_astExpressionConstructor *ast)
{
    const MOJOSHADER_astDataType *dt = reduce_datatype(ctx, ast->datatype);
    const MOJOSHADER_astDataTypeType type = datatype_base(ctx, dt)->type;
    const int elems = datatype_elems(ctx, dt);
    assert(elems <= 16);  // just in case (matrix4x4 constructor is largest).
    return new_ir_construct(ctx, build_ir_exprlist(ctx, ast->args), type, elems);
}